

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

string * __thiscall
NDeviceChannel::getId_abi_cxx11_(string *__return_storage_ptr__,NDeviceChannel *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->id);
  return __return_storage_ptr__;
}

Assistant:

std::string NDeviceChannel::getId() const
{
    return id;
}